

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::normal_dist<double>::cdf(normal_dist<double> *this,result_type_conflict2 x)

{
  param_type *in_RDI;
  double dVar1;
  
  param_type::mu(in_RDI);
  param_type::sigma(in_RDI);
  dVar1 = math::Phi((double)in_RDI);
  return dVar1;
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return math::Phi(x);
    }